

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

Snapshot * __thiscall
cmState::Snapshot::GetBuildsystemDirectoryParent(Snapshot *__return_storage_ptr__,Snapshot *this)

{
  cmState *pcVar1;
  cmLinkedTree<cmState::SnapshotDataType> *pcVar2;
  PositionType PVar3;
  bool bVar4;
  PointerType pSVar5;
  PointerType pBVar6;
  iterator other;
  iterator other_00;
  PositionType parentPos;
  iterator local_28;
  
  (__return_storage_ptr__->Position).Position = 0;
  __return_storage_ptr__->State = (cmState *)0x0;
  (__return_storage_ptr__->Position).Tree = (cmLinkedTree<cmState::SnapshotDataType> *)0x0;
  if (this->State != (cmState *)0x0) {
    other.Tree = &this->State->SnapshotData;
    other.Position = 0;
    bVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator==(&this->Position,other);
    if (!bVar4) {
      pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&this->Position);
      local_28.Tree = (pSVar5->DirectoryParent).Tree;
      local_28.Position = (pSVar5->DirectoryParent).Position;
      other_00.Tree = &this->State->SnapshotData;
      other_00.Position = 0;
      bVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator!=(&local_28,other_00);
      if (bVar4) {
        pcVar1 = this->State;
        pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_28);
        pBVar6 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                           (&pSVar5->BuildSystemDirectory);
        pcVar2 = (pBVar6->DirectoryEnd).Tree;
        PVar3 = (pBVar6->DirectoryEnd).Position;
        __return_storage_ptr__->State = pcVar1;
        (__return_storage_ptr__->Position).Tree = pcVar2;
        (__return_storage_ptr__->Position).Position = PVar3;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

cmState::Snapshot cmState::Snapshot::GetBuildsystemDirectoryParent() const
{
  Snapshot snapshot;
  if (!this->State || this->Position == this->State->SnapshotData.Root())
    {
    return snapshot;
    }
  PositionType parentPos = this->Position->DirectoryParent;
  if (parentPos != this->State->SnapshotData.Root())
    {
    snapshot = Snapshot(this->State,
                        parentPos->BuildSystemDirectory->DirectoryEnd);
    }

  return snapshot;
}